

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O0

void __thiscall
IsNotPositiveInfinityTests::IsNotPositiveInfinityTests(IsNotPositiveInfinityTests *this)

{
  IsNotPositiveInfinityTests *this_local;
  
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__IsNotPositiveInfinityTests_00614de0;
  return;
}

Assistant:

virtual void Run() {
		Then("Is::Not::PositiveInfinity(0.0f) is Not::False", []() {
			AssertThat(ut11::Is::Not::PositiveInfinity(0.0f), ut11::Is::Not::False);
		});

		Then("Is::Not::PositiveInfinity(+Infinity) is Not::", []() {
			AssertThat(ut11::Is::Not::PositiveInfinity(std::numeric_limits<float>::infinity()), ut11::Is::Not::True);
		});

		Then("Is::Not::PositiveInfinity(-Infinity) is Not::False", []() {
			AssertThat(ut11::Is::Not::PositiveInfinity(-std::numeric_limits<float>::infinity()), ut11::Is::Not::False);
		});

		Then("Is::Not::PositiveInfinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::PositiveInfinity) >::value, ut11::Is::True);
		});

		Then("Is::Not::PositiveInfinity has an error message", []() {
			AssertThat(ut11::Is::Not::PositiveInfinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});
	}